

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCountTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::TextureCountTests::init(TextureCountTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format_00;
  deUint32 dataType_00;
  Context *context;
  char *pcVar1;
  Texture2DRenderCase *this_00;
  char *description_00;
  TextureCountTests *pTVar2;
  Matrix<float,_3,_3> local_170;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string description;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string name;
  int numTextures;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 wrapT;
  deUint32 wrapS;
  deUint32 dataType;
  deUint32 format;
  int cntNdx;
  int formatNdx;
  TextureCountTests *this_local;
  
  format = 0;
  pTVar2 = this;
  while ((int)format < 4) {
    for (dataType = 0; (int)dataType < 4; dataType = dataType + 1) {
      format_00 = init::texFormats[(int)format].format;
      dataType_00 = init::texFormats[(int)format].dataType;
      name.field_2._12_4_ = init::texCounts[(int)dataType];
      pcVar1 = init::texFormats[(int)format].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar1,&local_b1);
      std::operator+(&local_90,&local_b0,"_");
      de::toString<int>((string *)((long)&description.field_2 + 8),
                        (int *)(name.field_2._M_local_buf + 0xc));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&description.field_2 + 8));
      std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      pcVar1 = glu::getTextureFormatName(format_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar1,&local_149);
      std::operator+(&local_128,&local_148,", ");
      pcVar1 = glu::getTypeName(dataType_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,pcVar1);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      this_00 = (Texture2DRenderCase *)operator_new(0x220);
      context = (this->super_TestCaseGroup).m_context;
      pcVar1 = (char *)std::__cxx11::string::c_str();
      description_00 = (char *)std::__cxx11::string::c_str();
      tcu::Matrix<float,_3,_3>::Matrix(&local_170);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,pcVar1,description_00,format_00,dataType_00,0x812f,0x812f,0x2600,
                 0x2600,&local_170,name.field_2._12_4_,false);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_170);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_70);
    }
    format = format + 1;
    pTVar2 = (TextureCountTests *)(ulong)format;
  }
  return (int)pTVar2;
}

Assistant:

void TextureCountTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};
	static const int texCounts[] = { 1, 2, 4, 8 };

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		for (int cntNdx = 0; cntNdx < DE_LENGTH_OF_ARRAY(texCounts); cntNdx++)
		{
			deUint32	format			= texFormats[formatNdx].format;
			deUint32	dataType		= texFormats[formatNdx].dataType;
			deUint32	wrapS			= GL_CLAMP_TO_EDGE;
			deUint32	wrapT			= GL_CLAMP_TO_EDGE;
			deUint32	minFilter		= GL_NEAREST;
			deUint32	magFilter		= GL_NEAREST;
			int			numTextures		= texCounts[cntNdx];
			string		name			= string(texFormats[formatNdx].name) + "_" + de::toString(numTextures);
			string		description		= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

			addChild(new Texture2DRenderCase(m_context, name.c_str(), description.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
		}
	}
}